

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>>,std::complex<double>,TPZStructMatrixOR<std::complex<double>>>
::Assemble(TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>>,std::complex<double>,TPZStructMatrixOR<std::complex<double>>>
           *this)

{
  TPZAutoPointer<TPZGuiInterface> *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  
  TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
  ::Assemble((TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
              *)(this + *(long *)(*(long *)this + -0x68)),in_RSI,in_RDX,in_RCX);
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::Assemble(TPZBaseMatrix & stiff_base, TPZBaseMatrix & rhs_base, TPZAutoPointer<TPZGuiInterface> guiInterface){
    if(!dynamic_cast<TPZMatrix<TVar>*>(&stiff_base) ||
       dynamic_cast<TPZFMatrix<TVar>*>(&rhs_base)){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible types. Aborting...\n";
        DebugStop();
    }
	auto& stiffness = dynamic_cast<TPZMatrix<TVar>&>(stiff_base);
    auto& rhs = dynamic_cast<TPZFMatrix<TVar>&>(rhs_base);
	int64_t iel;
	int64_t numel = 0, nelem = this->fMesh->NElements();
	TPZElementMatrixT<TVar> ek(this->fMesh,TPZElementMatrix::EK),ef(this->fMesh,TPZElementMatrix::EF);
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = this->fMesh->ElementVec();
	
	
	/**Rearange elements order*/
	TPZVec<int> elorder(this->fMesh->NEquations(),0);
	
	OrderElement();
	
	for(iel=0; iel < nelem; iel++) {
		
        int64_t elindex = fElementOrder[iel];
		if(elindex < 0) continue;
		TPZCompEl *el = elementvec[elindex];
		if(!el) continue;
		TPZMaterial * mat = el->Material();
		if(mat)
		{
			int matid = mat->Id();
			if(this->ShouldCompute(matid) == false)
			{
				continue;
			}
		}
		else
		{
		}
		
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		el->CalcStiff(ek,ef);
		
		
		std::cout<< " assemblando elemento frontal " << iel <<std::endl;
		
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness Frontal",sout);
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		
		AssembleElement(el, ek, ef, stiffness, rhs);
#ifdef PZ_LOG
		if(loggerel.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness depois de assemblada ",sout);
			LOGPZ_DEBUG(loggerel,sout.str())
		}
#endif
		
		if(!f_quiet)
		{
			cout << '*';
			if(!(numel%20)) {
				cout << " " << (100*iel/nelem) << "% Elements assembled " << endl;
				cout.flush();
			}
		}
		numel++;
		
	}//fim for iel
	
}